

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O2

bean_ptr<WrappedBytes> *
hiberlite::Registry<WrappedBytes>::createBeanPtr
          (bean_ptr<WrappedBytes> *__return_storage_ptr__,bean_key *key,WrappedBytes *obj)

{
  bean_key *pbVar1;
  real_bean<WrappedBytes> *this;
  shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *psVar2;
  iterator iVar3;
  mapped_type *pprVar4;
  logic_error *this_00;
  bean_key bStack_68;
  bean_key local_50;
  bean_key local_38;
  
  if (key->id == -1) {
    pbVar1 = &local_38;
    bean_key::bean_key(&local_38,key);
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>)._vptr_shared_res
         = (_func_int **)&PTR__shared_res_001bb848;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res =
         (shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)0x0;
  }
  else {
    this = (real_bean<WrappedBytes> *)operator_new(0x28);
    bean_key::bean_key(&bStack_68,key);
    real_bean<WrappedBytes>::real_bean(this,&bStack_68,obj);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&bStack_68.con);
    psVar2 = (shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)operator_new(0x18);
    psVar2->res = this;
    psVar2->refCount = 0;
    ((shared_cnt_obj_pair<hiberlite::real_bean<WrappedBytes>_> *)&psVar2->_vptr_shared_cnt_obj_pair)
    ->_vptr_shared_cnt_obj_pair = (_func_int **)&PTR__rb_pair_001bb8b0;
    iVar3 = std::
            _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
            ::find((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
                    *)rbpairs,key);
    if (iVar3._M_node != (_Base_ptr)(rbpairs + 8)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"bean already exists");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pbVar1 = &local_50;
    pprVar4 = std::
              map<hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
              ::operator[]((map<hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<WrappedBytes>_*>_>_>
                            *)rbpairs,key);
    *pprVar4 = (mapped_type)psVar2;
    bean_key::bean_key(&local_50,key);
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>)._vptr_shared_res
         = (_func_int **)&PTR__shared_res_001bb848;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<WrappedBytes>_>).res = psVar2;
    psVar2->refCount = psVar2->refCount + 1;
  }
  shared_res<hiberlite::autoclosed_con>::~shared_res(&pbVar1->con);
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::createBeanPtr(bean_key key, C* obj)
{
	if(key.id==Database::NULL_ID)
		return bean_ptr<C>(key,NULL);

	real_bean<C>* rb=new real_bean<C>(key,obj);
	rb_pair<C>* para=new rb_pair<C>(rb);

	if( rbpairs.find(key)!=rbpairs.end() )
		throw std::logic_error("bean already exists");

	rbpairs[key]=para;

	bean_ptr<C> ans(key, para);
	return ans;
}